

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O3

void __thiscall cfd::api::json::DecodePsbtResponse::~DecodePsbtResponse(DecodePsbtResponse *this)

{
  pointer pcVar1;
  
  (this->super_JsonClassBase<cfd::api::json::DecodePsbtResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtResponse_002b1e90;
  std::vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>::
  ~vector(&(this->outputs_).super_JsonVector<cfd::api::json::DecodePsbtOutput>.
           super_vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
         );
  std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>::
  ~vector(&(this->inputs_).super_JsonVector<cfd::api::json::DecodePsbtInput>.
           super_vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
         );
  std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>::~vector
            (&(this->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>.
              super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
            );
  std::vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>::
  ~vector(&(this->xpubs_).super_JsonVector<cfd::api::json::PsbtGlobalXpub>.
           super_vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
         );
  pcVar1 = (this->tx_hex_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->tx_hex_).field_2) {
    operator_delete(pcVar1);
  }
  DecodeRawTransactionResponse::~DecodeRawTransactionResponse(&this->tx_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->ignore_items)._M_t);
  return;
}

Assistant:

virtual ~DecodePsbtResponse() {
    // do nothing
  }